

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.hpp
# Opt level: O0

string * __thiscall OpenMD::Mie::getName_abi_cxx11_(Mie *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xa8));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }